

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_grow(mp_int *a,int size)

{
  int iVar1;
  void *pvVar2;
  int in_ESI;
  long in_RDI;
  mp_digit *tmp;
  int i;
  int local_18;
  
  if (*(int *)(in_RDI + 4) < in_ESI) {
    iVar1 = (0x40 - in_ESI % 0x20) + in_ESI;
    pvVar2 = realloc(*(void **)(in_RDI + 0x10),(long)iVar1 << 3);
    if (pvVar2 == (void *)0x0) {
      return -2;
    }
    *(void **)(in_RDI + 0x10) = pvVar2;
    local_18 = *(int *)(in_RDI + 4);
    *(int *)(in_RDI + 4) = iVar1;
    for (; local_18 < *(int *)(in_RDI + 4); local_18 = local_18 + 1) {
      *(undefined8 *)(*(long *)(in_RDI + 0x10) + (long)local_18 * 8) = 0;
    }
  }
  return 0;
}

Assistant:

int mp_grow (mp_int * a, int size)
{
  int     i;
  mp_digit *tmp;

  /* if the alloc size is smaller alloc more ram */
  if (a->alloc < size) {
    /* ensure there are always at least MP_PREC digits extra on top */
    size += (MP_PREC * 2) - (size % MP_PREC);

    /* reallocate the array a->dp
     *
     * We store the return in a temporary variable
     * in case the operation failed we don't want
     * to overwrite the dp member of a.
     */
    tmp = OPT_CAST(mp_digit) XREALLOC (a->dp, sizeof (mp_digit) * size);
    if (tmp == NULL) {
      /* reallocation failed but "a" is still valid [can be freed] */
      return MP_MEM;
    }

    /* reallocation succeeded so set a->dp */
    a->dp = tmp;

    /* zero excess digits */
    i        = a->alloc;
    a->alloc = size;
    for (; i < a->alloc; i++) {
      a->dp[i] = 0;
    }
  }
  return MP_OKAY;
}